

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

Path * __thiscall Pathie::Path::real(Path *__return_storage_ptr__,Path *this)

{
  char *pcVar1;
  size_t sVar2;
  ErrnoError *this_00;
  int *piVar3;
  string nstr;
  char path [4096];
  string local_1078;
  string local_1058;
  string local_1038;
  char local_1018 [4096];
  
  utf8_to_filename(&local_1038,&this->m_path);
  pcVar1 = realpath(local_1038._M_dataplus._M_p,local_1018);
  if (pcVar1 != (char *)0x0) {
    local_1078._M_dataplus._M_p = (pointer)&local_1078.field_2;
    sVar2 = strlen(local_1018);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1078,local_1018,local_1018 + sVar2);
    filename_to_utf8(&local_1058,&local_1078);
    Path(__return_storage_ptr__,&local_1058);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1058._M_dataplus._M_p != &local_1058.field_2) {
      operator_delete(local_1058._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1078._M_dataplus._M_p != &local_1078.field_2) {
      operator_delete(local_1078._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1038._M_dataplus._M_p != &local_1038.field_2) {
      operator_delete(local_1038._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
  this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
  piVar3 = __errno_location();
  ErrnoError::ErrnoError(this_00,*piVar3);
  __cxa_throw(this_00,&ErrnoError::typeinfo,GlobError::~GlobError);
}

Assistant:

Path Path::real() const
{
#if defined(_PATHIE_UNIX)
  std::string nstr = native();
  char path[PATH_MAX];
  if (!realpath(nstr.c_str(), path))
    throw(Pathie::ErrnoError(errno));

  return Path(filename_to_utf8(path));
#elif defined(_WIN32)
  // On Windows there sadly is no easy way to do this. We can
  // only determine if a given path is a symlink and resolve it...
  // Instructions taken from: http://msdn.microsoft.com/en-us/library/windows/desktop/aa363940%28v=vs.85%29.aspx
  std::vector<Path> components = burst();
  unsigned int pos = 0;

  while (pos < components.size()) {
    // Build path consisting of all elements upto our position pointer
    Path reduced_path(components.front());
    if (components.size() - pos > 1) {
      for (unsigned int i=1; i <= pos; i++) { // i=0 is already in the initialization above
        reduced_path = reduced_path.join(components[i]);
      }
    }

    // If that’s a symlink, resolve it and replace our path until
    // the symlink with the symlink’s target.
    /*std::wstring reduced_path_utf16 = utf8_to_utf16(reduced_path.m_path);
    if (is_ntfs_symlink(reduced_path_utf16.c_str())) {
      wchar_t* target_utf16 = read_ntfs_symlink(reduced_path_utf16.c_str());
      Path target(utf16_to_utf8(target_utf16));
      std::vector<Path> target_components = target.burst();
      free(target_utf16);

      // Replace all components up to pos with the symlink target
      components.erase(components.begin(), components.begin() + pos);
      std::vector<Path> temp(components);
      components.clear();
      for(auto iter=target_components.begin(); iter != target_components.end(); iter++)
        components.push_back(*iter);
      for(auto iter=temp.begin(); iter != temp.end(); iter++)
        components.push_back(*iter);
    }
    else {*/
      // Note a symlink can point to another symlink, so we can only
      // advance to the next element if this element has been tested
      // for not being a symlink.
      pos++;
      //}
  }

  // BUild a new path from the now resolved components
  Path result(components.front());
  if (components.size() > 1) {
    for(std::vector<Path>::const_iterator iter=components.begin();
    		iter != components.end(); iter++) {
      result = result.join(*iter);
    }
  }

  return result;
#else
#error Unsupported system.
#endif
}